

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeLeave(Vdbe *p)

{
  int iVar1;
  long lVar2;
  long *in_RDI;
  int nDb;
  Db *aDb;
  sqlite3 *db;
  int i;
  int local_c;
  
  lVar2 = *(long *)(*in_RDI + 0x20);
  iVar1 = *(int *)(*in_RDI + 0x28);
  for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
    if (((local_c != 1) && ((*(uint *)(in_RDI + 0x1a) & 1 << ((byte)local_c & 0x1f)) != 0)) &&
       (*(long *)(lVar2 + (long)local_c * 0x20 + 8) != 0)) {
      sqlite3BtreeLeave((Btree *)0x172588);
    }
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeLeave(Vdbe *p){
  int i;
  sqlite3 *db;
  Db *aDb;
  int nDb;
  db = p->db;
  aDb = db->aDb;
  nDb = db->nDb;
  for(i=0; i<nDb; i++){
    if( i!=1 && DbMaskTest(p->lockMask,i) && ALWAYS(aDb[i].pBt!=0) ){
      sqlite3BtreeLeave(aDb[i].pBt);
    }
  }
}